

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

bool anon_unknown.dwarf_10750b::is_expected_dir(dirent *d,not_null<const_directory_*> expected)

{
  not_null<const_pstore::romfs::directory_*> *pnVar1;
  bool bVar2;
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> od;
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> eStack_28;
  
  pstore::romfs::dirent::opendir((dirent *)&eStack_28,(char *)d);
  if (eStack_28.has_error_ == false) {
    pnVar1 = pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
             value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>const&,pstore::gsl::not_null<pstore::romfs::directory_const*>const>
                       (&eStack_28);
    bVar2 = pnVar1->ptr_ == expected.ptr_;
  }
  else {
    bVar2 = false;
  }
  if (eStack_28.has_error_ == false) {
    pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
    value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
              (&eStack_28);
  }
  else {
    pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
    error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,std::error_code>
              (&eStack_28);
  }
  return bVar2;
}

Assistant:

bool is_expected_dir (dirent const & d, not_null<directory const *> const expected) {
        auto const od = d.opendir ();
        return od && *od == expected;
    }